

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

bool jbcoin::STObject::equivalentSTObjectSameTemplate(STObject *obj1,STObject *obj2)

{
  bool bVar1;
  iterator *piVar2;
  iterator *piVar3;
  iterator *piVar4;
  iterator *piVar5;
  STObject *this;
  STObject *obj2_local;
  STObject *obj1_local;
  
  if (obj1->mType == (SOTemplate *)0x0) {
    __assert_fail("obj1.mType != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fc,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  if (obj1->mType == obj2->mType) {
    this = obj2;
    piVar2 = begin((iterator *)obj1,obj2);
    piVar3 = end((iterator *)obj1,this);
    piVar4 = begin((iterator *)obj2,this);
    piVar5 = end((iterator *)obj2,this);
    bVar1 = std::
            equal<boost::iterators::transform_iterator<jbcoin::STObject::Transform,__gnu_cxx::__normal_iterator<jbcoin::detail::STVar_const*,std::vector<jbcoin::detail::STVar,std::allocator<jbcoin::detail::STVar>>>,boost::use_default,boost::use_default>,boost::iterators::transform_iterator<jbcoin::STObject::Transform,__gnu_cxx::__normal_iterator<jbcoin::detail::STVar_const*,std::vector<jbcoin::detail::STVar,std::allocator<jbcoin::detail::STVar>>>,boost::use_default,boost::use_default>,jbcoin::STObject::equivalentSTObjectSameTemplate(jbcoin::STObject_const&,jbcoin::STObject_const&)::__0>
                      (piVar2,piVar3,piVar4,piVar5);
    return bVar1;
  }
  __assert_fail("obj1.mType == obj2.mType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                ,0x2fd,
                "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
               );
}

Assistant:

bool STObject::equivalentSTObjectSameTemplate (
    STObject const& obj1, STObject const& obj2)
{
    assert (obj1.mType != nullptr);
    assert (obj1.mType == obj2.mType);

    return std::equal (obj1.begin (), obj1.end (), obj2.begin (), obj2.end (),
        [] (STBase const& st1, STBase const& st2)
        {
            return (st1.getSType() == st2.getSType()) &&
                st1.isEquivalent (st2);
        });
}